

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O2

mbedtls_md_info_t * mbedtls_md_info_from_string(char *md_name)

{
  int iVar1;
  mbedtls_md_info_t *pmVar2;
  
  if (md_name == (char *)0x0) {
    pmVar2 = (mbedtls_md_info_t *)0x0;
  }
  else {
    iVar1 = strcmp("MD5",md_name);
    if (iVar1 == 0) {
      pmVar2 = &mbedtls_md5_info;
    }
    else {
      iVar1 = strcmp("RIPEMD160",md_name);
      if (iVar1 == 0) {
        pmVar2 = &mbedtls_ripemd160_info;
      }
      else {
        iVar1 = strcmp("SHA1",md_name);
        pmVar2 = &mbedtls_sha1_info;
        if ((iVar1 != 0) && (iVar1 = strcmp("SHA",md_name), iVar1 != 0)) {
          iVar1 = strcmp("SHA224",md_name);
          if (iVar1 == 0) {
            pmVar2 = &mbedtls_sha224_info;
          }
          else {
            iVar1 = strcmp("SHA256",md_name);
            if (iVar1 == 0) {
              pmVar2 = &mbedtls_sha256_info;
            }
            else {
              iVar1 = strcmp("SHA384",md_name);
              if (iVar1 == 0) {
                pmVar2 = &mbedtls_sha384_info;
              }
              else {
                iVar1 = strcmp("SHA512",md_name);
                pmVar2 = (mbedtls_md_info_t *)0x0;
                if (iVar1 == 0) {
                  pmVar2 = &mbedtls_sha512_info;
                }
              }
            }
          }
        }
      }
    }
  }
  return pmVar2;
}

Assistant:

const mbedtls_md_info_t *mbedtls_md_info_from_string( const char *md_name )
{
    if( NULL == md_name )
        return( NULL );

    /* Get the appropriate digest information */
#if defined(MBEDTLS_MD2_C)
    if( !strcmp( "MD2", md_name ) )
        return mbedtls_md_info_from_type( MBEDTLS_MD_MD2 );
#endif
#if defined(MBEDTLS_MD4_C)
    if( !strcmp( "MD4", md_name ) )
        return mbedtls_md_info_from_type( MBEDTLS_MD_MD4 );
#endif
#if defined(MBEDTLS_MD5_C)
    if( !strcmp( "MD5", md_name ) )
        return mbedtls_md_info_from_type( MBEDTLS_MD_MD5 );
#endif
#if defined(MBEDTLS_RIPEMD160_C)
    if( !strcmp( "RIPEMD160", md_name ) )
        return mbedtls_md_info_from_type( MBEDTLS_MD_RIPEMD160 );
#endif
#if defined(MBEDTLS_SHA1_C)
    if( !strcmp( "SHA1", md_name ) || !strcmp( "SHA", md_name ) )
        return mbedtls_md_info_from_type( MBEDTLS_MD_SHA1 );
#endif
#if defined(MBEDTLS_SHA256_C)
    if( !strcmp( "SHA224", md_name ) )
        return mbedtls_md_info_from_type( MBEDTLS_MD_SHA224 );
    if( !strcmp( "SHA256", md_name ) )
        return mbedtls_md_info_from_type( MBEDTLS_MD_SHA256 );
#endif
#if defined(MBEDTLS_SHA512_C)
#if !defined(MBEDTLS_SHA512_NO_SHA384)
    if( !strcmp( "SHA384", md_name ) )
        return mbedtls_md_info_from_type( MBEDTLS_MD_SHA384 );
#endif
    if( !strcmp( "SHA512", md_name ) )
        return mbedtls_md_info_from_type( MBEDTLS_MD_SHA512 );
#endif
    return( NULL );
}